

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O3

void PrintConstant(OutputContext *ctx,VmConstant *constant)

{
  VmValueType VVar1;
  uint uVar2;
  VmBlock *pVVar3;
  VariableData *container;
  TypeBase *pTVar4;
  FunctionData *pFVar5;
  bool bVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  
  VVar1 = (constant->super_VmValue).type.type;
  uVar2 = (constant->super_VmValue).type.size;
  if ((VVar1 == VM_TYPE_VOID) && (uVar2 == 0)) {
    pcVar8 = "{}";
LAB_0026e45b:
    Print(ctx,pcVar8);
    return;
  }
  if ((VVar1 == VM_TYPE_INT) && (uVar2 == 4)) {
    uVar2 = constant->iValue;
    pcVar8 = "%d";
LAB_0026e491:
    Print(ctx,pcVar8,(ulong)uVar2);
    return;
  }
  if ((VVar1 == VM_TYPE_DOUBLE) && (uVar2 == 8)) {
    Print(ctx,"%f",constant->dValue);
    return;
  }
  if ((VVar1 == VM_TYPE_LONG) && (uVar2 == 8)) {
    Print(ctx,"%lldl",constant->lValue);
    return;
  }
  switch(VVar1) {
  case VM_TYPE_BLOCK:
    pVVar3 = constant->bValue;
    pcVar8 = (pVVar3->name).begin;
    uVar7 = *(int *)&(pVVar3->name).end - (int)pcVar8;
    uVar2 = pVVar3->uniqueId;
    pcVar9 = "%.*s.b%d";
    break;
  case VM_TYPE_FUNCTION:
    pFVar5 = constant->fValue->function;
    if (pFVar5 == (FunctionData *)0x0) {
      pcVar8 = "global.f0000";
      goto LAB_0026e45b;
    }
    pcVar8 = (pFVar5->name->name).begin;
    uVar7 = *(int *)&(pFVar5->name->name).end - (int)pcVar8;
    uVar2 = pFVar5->uniqueId;
    pcVar9 = "%.*s.f%04x";
    break;
  case VM_TYPE_POINTER:
    container = constant->container;
    uVar2 = constant->iValue;
    if (container != (VariableData *)0x0) {
      pcVar8 = (container->name->name).begin;
      uVar10 = *(int *)&(container->name->name).end - (int)pcVar8;
      uVar7 = container->uniqueId;
      bVar6 = HasAddressTaken(container);
      pcVar9 = " (noalias)";
      if (bVar6) {
        pcVar9 = "";
      }
      if (uVar2 != 0) {
        Print(ctx,"%.*s.v%04x+0x%x%s",(ulong)uVar10,pcVar8,(ulong)uVar7,(ulong)uVar2,pcVar9);
        return;
      }
      Print(ctx,"%.*s.v%04x%s",(ulong)uVar10,pcVar8,(ulong)uVar7);
      return;
    }
    pcVar8 = "0x%x";
    goto LAB_0026e491;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                  ,0x54,"void PrintConstant(OutputContext &, VmConstant *)");
  case VM_TYPE_STRUCT:
    pTVar4 = (constant->super_VmValue).type.structType;
    Print(ctx,"{ %.*s }",(ulong)(uint)(*(int *)&(pTVar4->name).end - (int)(pTVar4->name).begin));
    return;
  }
  Print(ctx,pcVar9,(ulong)uVar7,pcVar8,(ulong)uVar2);
  return;
}

Assistant:

void PrintConstant(OutputContext &ctx, VmConstant *constant)
{
	if(constant->type == VmType::Void)
		Print(ctx, "{}");
	else if(constant->type == VmType::Int)
		Print(ctx, "%d", constant->iValue);
	else if(constant->type == VmType::Double)
		Print(ctx, "%f", constant->dValue);
	else if(constant->type == VmType::Long)
		Print(ctx, "%lldl", constant->lValue);
	else if(constant->type.type == VM_TYPE_POINTER && constant->container && constant->iValue)
		Print(ctx, "%.*s.v%04x+0x%x%s", FMT_ISTR(constant->container->name->name), constant->container->uniqueId, constant->iValue, HasAddressTaken(constant->container) ? "" : " (noalias)");
	else if(constant->type.type == VM_TYPE_POINTER && constant->container)
		Print(ctx, "%.*s.v%04x%s", FMT_ISTR(constant->container->name->name), constant->container->uniqueId, HasAddressTaken(constant->container) ? "" : " (noalias)");
	else if(constant->type.type == VM_TYPE_POINTER)
		Print(ctx, "0x%x", constant->iValue);
	else if(constant->type.type == VM_TYPE_STRUCT)
		Print(ctx, "{ %.*s }", FMT_ISTR(constant->type.structType->name));
	else if(constant->type.type == VM_TYPE_BLOCK)
		Print(ctx, "%.*s.b%d", FMT_ISTR(constant->bValue->name), constant->bValue->uniqueId);
	else if(constant->type.type == VM_TYPE_FUNCTION && constant->fValue->function)
		Print(ctx, "%.*s.f%04x", FMT_ISTR(constant->fValue->function->name->name), constant->fValue->function->uniqueId);
	else if(constant->type.type == VM_TYPE_FUNCTION)
		Print(ctx, "global.f0000");
	else
		assert(!"unknown type");
}